

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point_Cloud.h
# Opt level: O2

uint __thiscall Nova::Point_Cloud<double,_3>::Add_Vertex(Point_Cloud<double,_3> *this,TV *X)

{
  std::vector<Nova::Vector<double,_3,_true>,_std::allocator<Nova::Vector<double,_3,_true>_>_>::
  push_back((vector<Nova::Vector<double,_3,_true>,_std::allocator<Nova::Vector<double,_3,_true>_>_>
             *)this,X);
  return (uint)(((long)(this->points)._data.
                       super__Vector_base<Nova::Vector<double,_3,_true>,_std::allocator<Nova::Vector<double,_3,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->points)._data.
                      super__Vector_base<Nova::Vector<double,_3,_true>,_std::allocator<Nova::Vector<double,_3,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18);
}

Assistant:

unsigned Add_Vertex(const TV& X)
    {
        points.Append(X);
        return points.size();
    }